

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O0

void __thiscall FConfigFile::~FConfigFile(FConfigFile *this)

{
  FConfigSection *pFVar1;
  FConfigEntry *pFVar2;
  FConfigEntry *nextentry;
  FConfigEntry *entry;
  FConfigSection *nextsection;
  FConfigSection *section;
  FConfigFile *this_local;
  
  this->_vptr_FConfigFile = (_func_int **)&PTR__FConfigFile_009f1ec0;
  pFVar1 = this->Sections;
  while (nextsection = pFVar1, nextsection != (FConfigSection *)0x0) {
    pFVar1 = nextsection->Next;
    pFVar2 = nextsection->RootEntry;
    while (nextentry = pFVar2, nextentry != (FConfigEntry *)0x0) {
      pFVar2 = nextentry->Next;
      if (nextentry->Value != (char *)0x0) {
        operator_delete__(nextentry->Value);
      }
      if (nextentry != (FConfigEntry *)0x0) {
        operator_delete__(nextentry);
      }
    }
    if (nextsection != (FConfigSection *)0x0) {
      FConfigSection::~FConfigSection(nextsection);
      operator_delete(nextsection,0x28);
    }
  }
  FString::~FString(&this->PathName);
  return;
}

Assistant:

FConfigFile::~FConfigFile ()
{
	FConfigSection *section = Sections;

	while (section != NULL)
	{
		FConfigSection *nextsection = section->Next;
		FConfigEntry *entry = section->RootEntry;

		while (entry != NULL)
		{
			FConfigEntry *nextentry = entry->Next;
			delete[] entry->Value;
			delete[] (char *)entry;
			entry = nextentry;
		}
		delete section;
		section = nextsection;
	}
}